

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::DiskSourceTreeTest::AddFile
          (DiskSourceTreeTest *this,string *filename,char *contents)

{
  char *pcVar1;
  Nonnull<const_char_*> failure_msg;
  string_view contents_00;
  LogMessageFatal local_28;
  
  pcVar1 = (char *)strlen((char *)filename);
  contents_00._M_str = pcVar1;
  contents_00._M_len = (size_t)&local_28;
  File::WriteStringToFile(contents_00,filename);
  if (local_28.super_LogMessage._0_8_ == 1) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                            ((Nonnull<const_absl::Status_*>)&local_28,
                             "File::SetContents(filename, contents, true) is OK");
  }
  absl::lts_20250127::Status::~Status((Status *)&local_28);
  if (local_28.super_LogMessage._0_8_ == 1) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/importer_unittest.cc"
             ,0x106,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_28);
}

Assistant:

void AddFile(const std::string& filename, const char* contents) {
    ABSL_CHECK_OK(File::SetContents(filename, contents, true));
  }